

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O2

vector<long_long,_std::allocator<long_long>_> *
multiplyPolynomialsNTT
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          vector<long_long,_std::allocator<long_long>_> *a,
          vector<long_long,_std::allocator<long_long>_> *b)

{
  long *plVar1;
  pointer plVar2;
  byte bVar3;
  pointer puVar4;
  uint uVar5;
  ulong uVar6;
  vector<long_long,_std::allocator<long_long>_> *pvVar7;
  ulong uVar8;
  long lVar9;
  int i;
  long lVar10;
  long *plVar11;
  pointer *this;
  undefined1 auStack_a8 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> v [2];
  unsigned_long_long local_38;
  
  uVar8 = (long)(a->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(a->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar6 = (long)(b->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(b->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar6 < uVar8) {
    uVar6 = uVar8;
  }
  lVar10 = 0;
  do {
    bVar3 = (byte)lVar10;
    lVar10 = lVar10 + 1;
  } while ((ulong)(long)(1 << (bVar3 & 0x1f)) < uVar6);
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v[1].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uVar5 = 2 << (bVar3 & 0x1f);
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    pvVar7 = b;
    if (lVar9 == 0) {
      pvVar7 = a;
    }
    plVar1 = (pvVar7->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    this = &v[lVar9 + -1].
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    for (plVar11 = (pvVar7->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_start; plVar11 != plVar1; plVar11 = plVar11 + 1) {
      local_38 = (*plVar11 + 0xc0000001U) % 0xc0000001;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
      emplace_back<unsigned_long_long>
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,&local_38);
    }
    local_38 = 0;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,
               (long)(int)uVar5,&local_38);
    ntt((int)lVar10,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this,false);
  }
  uVar8 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    *(ulong *)((long)auStack_a8 + uVar8 * 8) =
         (v[0].super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[uVar8] *
         *(pointer)((long)auStack_a8 + uVar8 * 8)) % 0xc0000001;
  }
  ntt((int)lVar10,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_a8,true
     );
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (__return_storage_ptr__,(long)(int)uVar5,(allocator_type *)&local_38);
  puVar4 = inv2.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (__return_storage_ptr__->super__Vector_base<long_long,_std::allocator<long_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    plVar2[uVar8] = (puVar4[lVar10] * *(pointer)((long)auStack_a8 + uVar8 * 8)) % 0xc0000001;
  }
  lVar10 = 0x18;
  do {
    std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               ((long)v + lVar10 + -8));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

vector<ll> multiplyPolynomialsNTT(vector<ll> &a, vector<ll> &b) {
    int k = 0;
    while ((1 << k) < a.size() || (1 << k) < b.size()) k++;
    k++;
    
    vector<ull> v[2];
    rep(j, 0, 2) {
        for (auto x : (j ? b : a)) v[j].push_back((x + P) % P);
        v[j].resize(1 << k, 0);
        ntt(k, v[j], false);
    }
    
    rep(i, 0, 1 << k) v[0][i] = (v[0][i] * v[1][i]) % P;
    ntt(k, v[0], true);
    vector<ll> res(1 << k);
    rep(i, 0, 1 << k) res[i] = (v[0][i] * inv2[k]) % P;
    return res;
}